

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

Matrix * Matrix::identity(Matrix *__return_storage_ptr__,int dimensions)

{
  vector<float,_std::allocator<float>_> *pvVar1;
  int j;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  
  Matrix(__return_storage_ptr__,dimensions,dimensions);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < dimensions) {
    uVar4 = (ulong)(uint)dimensions;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    for (uVar2 = 0; (uint)dimensions != uVar2; uVar2 = uVar2 + 1) {
      fVar5 = 1.0;
      if (uVar3 != uVar2) {
        fVar5 = 0.0;
      }
      pvVar1 = operator[](__return_storage_ptr__,(int)uVar3);
      (pvVar1->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar2] = fVar5;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix Matrix::identity(int dimensions) {
    Matrix E(dimensions, dimensions);
    for (int i = 0; i < dimensions; i++) {
        for (int j = 0; j < dimensions; j++) {
            E[i][j] = (i == j ? 1.f : 0.f);
        }
    }
    return E;
}